

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O1

void LowerConstantIntoBlock
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  VmValueType VVar1;
  uint uVar2;
  uchar uVar3;
  bool rC;
  uint uVar4;
  RegVmInstructionCode code;
  SynBase *pSVar5;
  uint uVar6;
  int iVar7;
  uchar rC_00;
  
  if ((value == (VmValue *)0x0) || (value->typeID != 1)) {
    value = (VmValue *)0x0;
  }
  if ((VmConstant *)value == (VmConstant *)0x0) {
    __assert_fail("constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x138,
                  "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                 );
  }
  VVar1 = (((VmConstant *)value)->super_VmValue).type.type;
  uVar4 = (((VmConstant *)value)->super_VmValue).type.size;
  if ((VVar1 == VM_TYPE_INT) && (uVar4 == 4)) {
    uVar3 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
    pSVar5 = (((VmConstant *)value)->super_VmValue).source;
    uVar4 = ((VmConstant *)value)->iValue;
    code = rviLoadImm;
    rC_00 = '\0';
LAB_0018a28f:
    RegVmLoweredBlock::AddInstruction(lowBlock,ctx,pSVar5,code,uVar3,'\0',rC_00,uVar4);
  }
  else {
    if ((VVar1 == VM_TYPE_DOUBLE) && (uVar4 == 8)) {
      uVar3 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
      uVar4 = TryLowerConstantToMemory(lowBlock,value);
      if (uVar4 == 0) {
        __assert_fail("constantIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x148,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      pSVar5 = (((VmConstant *)value)->super_VmValue).source;
      code = rviLoadDouble;
LAB_0018a289:
      uVar4 = uVar4 * 4 - 4;
      rC_00 = '\x02';
      goto LAB_0018a28f;
    }
    if ((VVar1 == VM_TYPE_LONG) && (uVar4 == 8)) {
      uVar3 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
      uVar4 = TryLowerConstantToMemory(lowBlock,value);
      if (uVar4 == 0) {
        __assert_fail("constantIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x154,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
LAB_0018a26e:
      pSVar5 = (((VmConstant *)value)->super_VmValue).source;
      code = rviLoadLong;
      goto LAB_0018a289;
    }
    if (VVar1 == VM_TYPE_STRUCT) {
      if (((((VmConstant *)value)->super_VmValue).type.size & 3) != 0) {
        __assert_fail("constant->type.size % 4 == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x178,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      uVar4 = TryLowerConstantToMemory(lowBlock,value);
      if (uVar4 == 0) {
        __assert_fail("constantIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x17c,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      if ((((VmConstant *)value)->super_VmValue).type.size < 4) {
        return;
      }
      uVar4 = uVar4 * 4 - 4;
      iVar7 = 0;
      uVar6 = 0;
      while( true ) {
        uVar3 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
        if (result->count == result->max) {
          SmallArray<unsigned_char,_32U>::grow(result,result->count);
        }
        if (result->data == (uchar *)0x0) break;
        uVar2 = result->count;
        result->count = uVar2 + 1;
        result->data[uVar2] = uVar3;
        RegVmLoweredBlock::AddInstruction
                  (lowBlock,ctx,(((VmConstant *)value)->super_VmValue).source,
                   rviLoadLong -
                   (((((VmConstant *)value)->super_VmValue).type.size >> 2) + iVar7 < 2),uVar3,'\0',
                   '\x02',uVar4);
        uVar6 = uVar6 + 2;
        uVar4 = uVar4 + 8;
        iVar7 = iVar7 + -2;
        if ((((VmConstant *)value)->super_VmValue).type.size >> 2 <= uVar6) {
          return;
        }
      }
      goto LAB_0018a448;
    }
    if (VVar1 != VM_TYPE_POINTER) {
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                    ,0x18b,
                    "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                   );
    }
    uVar3 = RegVmLoweredFunction::GetRegisterForConstant(lowFunction);
    if (((VmConstant *)value)->container == (VariableData *)0x0) {
      if (((VmConstant *)value)->iValue != 0) {
        __assert_fail("constant->iValue == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x160,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      uVar4 = TryLowerConstantToMemory(lowBlock,value);
      if (uVar4 == 0) {
        __assert_fail("constantIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x166,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      goto LAB_0018a26e;
    }
    pSVar5 = (((VmConstant *)value)->super_VmValue).source;
    rC = IsLocalScope(((VmConstant *)value)->container->scope);
    RegVmLoweredBlock::AddInstruction
              (lowBlock,ctx,pSVar5,rviGetAddr,uVar3,'\0',rC,(VmConstant *)value);
  }
  if (result->count == result->max) {
    SmallArray<unsigned_char,_32U>::grow(result,result->count);
  }
  if (result->data != (uchar *)0x0) {
    uVar4 = result->count;
    result->count = uVar4 + 1;
    result->data[uVar4] = uVar3;
    return;
  }
LAB_0018a448:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,
                "void SmallArray<unsigned char, 32>::push_back(const T &) [T = unsigned char, N = 32]"
               );
}

Assistant:

void LowerConstantIntoBlock(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, SmallArray<unsigned char, 32> &result, VmValue *value)
{
	VmConstant *constant = getType<VmConstant>(value);

	assert(constant);

	if(constant->type == VmType::Int)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		lowBlock->AddInstruction(ctx, constant->source, rviLoadImm, targetReg, 0, 0, constant->iValue);

		result.push_back(targetReg);
	}
	else if(constant->type == VmType::Double)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		lowBlock->AddInstruction(ctx, constant->source, rviLoadDouble, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));

		result.push_back(targetReg);
	}
	else if(constant->type == VmType::Long)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));

		result.push_back(targetReg);
	}
	else if(constant->type.type == VM_TYPE_POINTER)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		if(!constant->container)
		{
			assert(constant->iValue == 0);

			if(NULLC_PTR_SIZE == 8)
			{
				unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

				assert(constantIndex);

				lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
			}
			else
			{
				lowBlock->AddInstruction(ctx, constant->source, rviLoadImm, targetReg, 0, 0, 0u);
			}
		}
		else
		{
			lowBlock->AddInstruction(ctx, constant->source, rviGetAddr, targetReg, 0, IsLocalScope(constant->container->scope) ? rvrrFrame : rvrrGlobals, constant);
		}

		result.push_back(targetReg);
	}
	else if(constant->type.type == VM_TYPE_STRUCT)
	{
		assert(constant->type.size % 4 == 0);

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		for(unsigned i = 0; i < constant->type.size / 4; i += 2)
		{
			unsigned char targetReg = lowFunction->GetRegisterForConstant();
			result.push_back(targetReg);

			if(constant->type.size / 4 - i >= 2)
				lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1 + i) * sizeof(unsigned));
			else
				lowBlock->AddInstruction(ctx, constant->source, rviLoadDword, targetReg, 0, rvrrConstants, (constantIndex - 1 + i) * sizeof(unsigned));
		}
	}
	else
	{
		assert(!"unknown type");
	}
}